

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::OneofDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *arena;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar3;
  Arena *arena_00;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  arena_00 = arena;
  if (((ulong)arena & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar3 = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_00f1e8a1:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_00f1e81c:
    protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar3,value,arena);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 3) == 0) goto LAB_00f1e84c;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar3 = (MessageLite *)&to_msg[1]._internal_metadata_;
      if (((ulong)arena & 1) != 0) goto LAB_00f1e8a1;
      goto LAB_00f1e81c;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pMVar3 = (MessageLite *)from_msg[2]._vptr_MessageLite;
    if (pMVar3 == (MessageLite *)0x0) {
      MergeImpl((OneofDescriptorProto *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)Arena::CopyConstruct<google::protobuf::OneofOptions>(arena_00,pMVar3);
      to_msg[2]._vptr_MessageLite = pp_Var2;
    }
    else {
      OneofOptions::MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,pMVar3);
    }
  }
LAB_00f1e84c:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void OneofDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<OneofDescriptorProto*>(&to_msg);
  auto& from = static_cast<const OneofDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.OneofDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}